

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O0

void __thiscall wallet::walletload_tests::DummyDescriptor::~DummyDescriptor(DummyDescriptor *this)

{
  long lVar1;
  DummyDescriptor *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~DummyDescriptor(in_RDI);
  operator_delete(in_RDI,0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~DummyDescriptor() = default;